

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O0

Elements * __thiscall
duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::Allocate
          (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *this,
          idx_t count)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Elements *pEVar4;
  pointer in_RSI;
  pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_> *in_RDI;
  unsigned_long num_cascades;
  Offsets cascades;
  Elements elements;
  unsigned_long num_runs;
  unsigned_long run_length;
  idx_t child_run_length;
  Elements lowest_level;
  unsigned_long cascading;
  unsigned_long fanout;
  size_type in_stack_fffffffffffffed8;
  undefined8 uVar5;
  pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>
  *in_stack_fffffffffffffee0;
  pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>
  *in_stack_fffffffffffffee8;
  undefined8 *__new_size;
  pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_> *this_00;
  pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_> local_c8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_20;
  undefined8 local_18;
  pointer local_10;
  
  local_18 = 0x20;
  local_20 = 0x20;
  local_10 = in_RSI;
  ::std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1a697ab);
  vector<unsigned_int,_true>::vector
            (&in_stack_fffffffffffffee0->first,in_stack_fffffffffffffed8,(allocator_type *)0x1a697c2
            );
  ::std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1a697d1);
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  __new_size = &local_98;
  this_00 = in_RDI;
  vector<unsigned_int,_true>::vector((vector<unsigned_int,_true> *)0x1a69804);
  ::std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>::
  pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>,_true>
            (in_RDI,&in_stack_fffffffffffffee8->first,&in_stack_fffffffffffffee0->first);
  ::std::
  vector<std::pair<duckdb::vector<unsigned_int,true>,duckdb::vector<unsigned_int,true>>,std::allocator<std::pair<duckdb::vector<unsigned_int,true>,duckdb::vector<unsigned_int,true>>>>
  ::emplace_back<std::pair<duckdb::vector<unsigned_int,true>,duckdb::vector<unsigned_int,true>>>
            ((vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
              *)in_RDI,in_stack_fffffffffffffee8);
  ::std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>::~pair
            (in_stack_fffffffffffffee0);
  vector<unsigned_int,_true>::~vector((vector<unsigned_int,_true> *)0x1a6984e);
  local_c8.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1;
  while (local_c8.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage < local_10) {
    local_c8.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((long)local_c8.second.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage * 0x20);
    local_c8.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((((long)local_10 - 1U) +
                         (long)local_c8.second.
                               super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish) /
                        (ulong)local_c8.second.
                               super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
    in_stack_fffffffffffffee8 = &local_c8;
    vector<unsigned_int,_true>::vector((vector<unsigned_int,_true> *)0x1a698b2);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,(size_type)__new_size)
    ;
    vector<unsigned_int,_true>::vector((vector<unsigned_int,_true> *)0x1a698d0);
    if ((pointer)0x20 <
        local_c8.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                 (size_type)__new_size);
    }
    ::std::
    vector<std::pair<duckdb::vector<unsigned_int,true>,duckdb::vector<unsigned_int,true>>,std::allocator<std::pair<duckdb::vector<unsigned_int,true>,duckdb::vector<unsigned_int,true>>>>
    ::emplace_back<duckdb::vector<unsigned_int,true>,duckdb::vector<unsigned_int,true>>
              ((vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                *)in_RDI,&in_stack_fffffffffffffee8->first,&in_stack_fffffffffffffee0->first);
    local_c8.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_c8.second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    vector<unsigned_int,_true>::~vector((vector<unsigned_int,_true> *)0x1a699ec);
    vector<unsigned_int,_true>::~vector((vector<unsigned_int,_true> *)0x1a699f6);
  }
  ::std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)in_RDI,(__int_type)in_stack_fffffffffffffee8);
  uVar5 = 0;
  ::std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)in_RDI,(__int_type)in_stack_fffffffffffffee8);
  this_00[1].second.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00[2].first.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x20;
  puVar1 = this_00[2].first.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = puVar1;
  auVar3._8_8_ = uVar5;
  auVar3._0_8_ = (long)local_10 + ((long)puVar1 - 1U);
  this_00[2].first.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = SUB168(auVar3 / auVar2,0);
  pEVar4 = LowestLevel((MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>
                        *)0x1a69a69);
  vector<unsigned_int,_true>::~vector((vector<unsigned_int,_true> *)0x1a69a7d);
  return pEVar4;
}

Assistant:

vector<E> &MergeSortTree<E, O, CMP, F, C>::Allocate(idx_t count) {
	const auto fanout = F;
	const auto cascading = C;
	Elements lowest_level(count);
	tree.emplace_back(Level(std::move(lowest_level), Offsets()));

	for (idx_t child_run_length = 1; child_run_length < count;) {
		const auto run_length = child_run_length * fanout;
		const auto num_runs = (count + run_length - 1) / run_length;

		Elements elements;
		elements.resize(count);

		//	Allocate cascading pointers only if there is room
		Offsets cascades;
		if (cascading > 0 && run_length > cascading) {
			const auto num_cascades = fanout * num_runs * (run_length / cascading + 2);
			cascades.resize(num_cascades);
		}

		//	Insert completed level and move up to the next one
		tree.emplace_back(std::move(elements), std::move(cascades));
		child_run_length = run_length;
	}

	//	Set up for parallel build
	build_level = 1;
	build_complete = 0;
	build_run = 0;
	build_run_length = fanout;
	build_num_runs = (count + build_run_length - 1) / build_run_length;

	return LowestLevel();
}